

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_send_recv.c
# Opt level: O2

int kvT_send_recv(int rank,int ranks)

{
  int iVar1;
  kvtree *pkVar2;
  kvtree *pkVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uStack_50;
  int val_of_three;
  int val_of_two;
  int val_of_one;
  kvtree *recv;
  kvtree *send;
  
  pkVar2 = (kvtree *)kvtree_new();
  send = pkVar2;
  pkVar3 = (kvtree *)kvtree_new();
  if (rank == 0) {
    pcVar4 = "ONE";
    uStack_50 = 1;
  }
  else if (rank == 1) {
    pcVar4 = "TWO";
    uStack_50 = 2;
  }
  else {
    pcVar4 = "THREE";
    uStack_50 = 3;
  }
  recv = pkVar3;
  kvtree_util_set_int(pkVar2,pcVar4,uStack_50);
  iVar1 = kvtree_sendrecv(pkVar2,(long)(rank + 1) % (long)ranks & 0xffffffff,pkVar3,
                          (long)(rank + ranks + -1) % (long)ranks & 0xffffffff,&ompi_mpi_comm_world)
  ;
  if (iVar1 != 0) {
    printf("test_kvtree_send_recv, kvtree_sendrecv call failed");
    uVar5 = 0xa0;
    goto LAB_0010183a;
  }
  if (rank == 0) {
    iVar1 = kvtree_util_get_int(pkVar2,"ONE",&val_of_one);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 0 could not read send value of \'ONE\'");
      uVar5 = 0xa7;
      goto LAB_0010183a;
    }
    if (val_of_one != 1) {
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      uVar5 = 0xac;
      goto LAB_0010183a;
    }
    iVar1 = kvtree_util_get_int(pkVar3,"THREE",&val_of_three);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of \'THREE\'");
      uVar5 = 0xb2;
      goto LAB_0010183a;
    }
    if (val_of_three != 3) {
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      uVar5 = 0xb7;
      goto LAB_0010183a;
    }
  }
  else if (rank == 2) {
    iVar1 = kvtree_util_get_int(pkVar2,"THREE",&val_of_three);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 2 could not read send value of \'THREE\'");
      uVar5 = 0xd7;
      goto LAB_0010183a;
    }
    if (val_of_three != 3) {
      printf("test_kvtree_send_recv, in rank 2 send value is not correct");
      uVar5 = 0xdc;
      goto LAB_0010183a;
    }
    iVar1 = kvtree_util_get_int(pkVar3,"TWO",&val_of_two);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 2 could not read recv value of \'TWO\'");
      uVar5 = 0xe2;
      goto LAB_0010183a;
    }
    if (val_of_two != 2) {
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      uVar5 = 0xe7;
      goto LAB_0010183a;
    }
  }
  else if (rank == 1) {
    iVar1 = kvtree_util_get_int(pkVar2,"TWO",&val_of_two);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 1 could not read send value of \'TWO\'");
      uVar5 = 0xbf;
      goto LAB_0010183a;
    }
    if (val_of_two != 2) {
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      uVar5 = 0xc4;
      goto LAB_0010183a;
    }
    iVar1 = kvtree_util_get_int(pkVar3,"ONE",&val_of_one);
    if (iVar1 != 0) {
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of \'ONE\'");
      uVar5 = 0xca;
      goto LAB_0010183a;
    }
    if (val_of_one != 1) {
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      uVar5 = 0xcf;
      goto LAB_0010183a;
    }
  }
  printf("rank = %d\n",(ulong)(uint)rank);
  puts("SEND HASH");
  kvtree_print(pkVar2,4);
  puts("RECEIVE HASH");
  kvtree_print(pkVar3,4);
  kvtree_delete(&send);
  if (send == (kvtree *)0x0) {
    kvtree_delete(&recv);
    if (recv == (kvtree *)0x0) {
      return 0;
    }
    printf("test_kvtree_send_recv, deletion of recv failed");
    uVar5 = 0xfc;
  }
  else {
    printf("test_kvtree_send_recv, deletion of kvtree failed");
    uVar5 = 0xf6;
  }
LAB_0010183a:
  printf("Error in line %d, file %s, function %s.\n",uVar5,
         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
         ,"kvT_send_recv");
  return 1;
}

Assistant:

int kvT_send_recv(int rank, int ranks){
  int kvtree_rc;
  int val_of_one, val_of_two, val_of_three;
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();
  if(rank == 0)
    kvtree_util_set_int(send, "ONE", 1);
  else if(rank == 1) 
    kvtree_util_set_int(send, "TWO", 2);
  else
    kvtree_util_set_int(send, "THREE", 3);
// with ranks in a circular queue, send to 1 rank forward, receive from 1 rank back
  kvtree_rc = kvtree_sendrecv(send, (rank+1) % ranks, recv, (rank-1+ranks) % ranks, MPI_COMM_WORLD);
  if(kvtree_rc != TEST_PASS){
    printf("test_kvtree_send_recv, kvtree_sendrecv call failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  if(rank == 0){
    kvtree_rc = kvtree_util_get_int(send, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read send value of 'ONE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if (val_of_one != 1){
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of 'THREE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if (val_of_three != 3){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }
  if(rank == 1){
    kvtree_rc = kvtree_util_get_int(send, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 1 could not read send value of 'TWO'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_two != 2){
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of 'ONE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_one != 1){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }
  if(rank == 2){
    kvtree_rc = kvtree_util_get_int(send, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 2 could not read send value of 'THREE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_three != 3){
      printf("test_kvtree_send_recv, in rank 2 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 2 could not read recv value of 'TWO'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_two != 2){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }

  printf("rank = %d\n", rank);
  printf("SEND HASH\n");
  kvtree_print(send, 4);
  printf("RECEIVE HASH\n");
  kvtree_print(recv, 4);
 
  
  kvtree_delete(&send);
  if (send != NULL){
    printf("test_kvtree_send_recv, deletion of kvtree failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
     return TEST_FAIL;
  }
  kvtree_delete(&recv);
  if (recv != NULL){
    printf("test_kvtree_send_recv, deletion of recv failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
     return TEST_FAIL;
  }

  return TEST_PASS;
}